

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::TestCase183::run(TestCase183 *this)

{
  char *pcVar1;
  size_t sVar2;
  short *psVar3;
  char *ptrCopy;
  bool bVar4;
  String result;
  String local_28;
  
  heapString(&local_28,3);
  sVar2 = local_28.content.size_;
  pcVar1 = local_28.content.ptr;
  psVar3 = (short *)local_28.content.size_;
  if ((short *)local_28.content.size_ != (short *)0x0) {
    psVar3 = (short *)local_28.content.ptr;
  }
  *(undefined1 *)(psVar3 + 1) = 0x6f;
  *psVar3 = 0x6f66;
  bVar4 = true;
  if ((short *)local_28.content.size_ == (short *)0x4) {
    bVar4 = (char)*(short *)((long)local_28.content.ptr + 2) != 'o' ||
            *(short *)local_28.content.ptr != 0x6f66;
  }
  if ((short *)local_28.content.ptr != (short *)0x0) {
    local_28.content.ptr = (char *)0x0;
    local_28.content.size_ = 0;
    (**(local_28.content.disposer)->_vptr_ArrayDisposer)
              (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar4 & Debug::minSeverity < 3)) {
    heapString(&local_28,3);
    psVar3 = (short *)local_28.content.size_;
    if ((short *)local_28.content.size_ != (short *)0x0) {
      psVar3 = (short *)local_28.content.ptr;
    }
    *(undefined1 *)(psVar3 + 1) = 0x6f;
    *psVar3 = 0x6f66;
    Debug::log<char_const(&)[52],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb8,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (kj::str(Stringable()))\", \"foo\", kj::str(Stringable())"
               ,(char (*) [52])"failed: expected (\"foo\") == (kj::str(Stringable()))",
               (char (*) [4])0x190ee3,&local_28);
    sVar2 = local_28.content.size_;
    pcVar1 = local_28.content.ptr;
    if ((short *)local_28.content.ptr != (short *)0x0) {
      local_28.content.ptr = (char *)0x0;
      local_28.content.size_ = 0;
      (**(local_28.content.disposer)->_vptr_ArrayDisposer)
                (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  return;
}

Assistant:

TEST(String, ToString) {
  EXPECT_EQ("foo", kj::str(Stringable()));
}